

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O2

void __thiscall cinatra::coro_http_server::stop(coro_http_server *this)

{
  __node_base *p_Var1;
  error_code ec;
  error_code local_38;
  
  if ((this->out_ctx_ != (io_context *)0x0) || ((this->thd_)._M_id._M_thread != 0)) {
    LOCK();
    (this->stop_timer_)._M_base._M_i = true;
    UNLOCK();
    local_38._M_value = 0;
    local_38._M_cat = (error_category *)std::_V2::system_category();
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::cancel(&this->check_timer_,&local_38);
    close_acceptor(this);
    std::mutex::lock(&this->conn_mtx_);
    p_Var1 = &(this->connections_)._M_h._M_before_begin;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      coro_http_connection::close
                (*(coro_http_connection **)
                  &((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor,0);
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->connections_)._M_h);
    pthread_mutex_unlock((pthread_mutex_t *)&this->conn_mtx_);
    if (this->out_ctx_ == (io_context *)0x0) {
      coro_io::io_context_pool::stop
                ((this->pool_)._M_t.
                 super___uniq_ptr_impl<coro_io::io_context_pool,_std::default_delete<coro_io::io_context_pool>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_coro_io::io_context_pool_*,_std::default_delete<coro_io::io_context_pool>_>
                 .super__Head_base<0UL,_coro_io::io_context_pool_*,_false>._M_head_impl);
      std::thread::join();
    }
    else {
      this->out_ctx_ = (io_context *)0x0;
    }
  }
  return;
}

Assistant:

void stop() {
    if (out_ctx_ == nullptr && !thd_.joinable()) {
      return;
    }

    stop_timer_ = true;
    std::error_code ec;
    check_timer_.cancel(ec);

    close_acceptor();

    // close current connections.
    {
      std::scoped_lock lock(conn_mtx_);
      for (auto &conn : connections_) {
        conn.second->close(false);
      }
      connections_.clear();
    }

    if (out_ctx_ == nullptr) {
      CINATRA_LOG_INFO << "wait for server's thread-pool finish all work.";
      pool_->stop();

      CINATRA_LOG_INFO << "server's thread-pool finished.";
      thd_.join();
      CINATRA_LOG_INFO << "stop coro_http_server ok";
    }
    else {
      out_ctx_ = nullptr;
    }
  }